

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<char> * __thiscall
cs::allocator_type<cs_impl::any::holder<char>,64ul,cs_impl::default_allocator_provider>::
alloc<char_const&>(allocator_type<cs_impl::any::holder<char>,_64UL,_cs_impl::default_allocator_provider>
                   *this,char *args)

{
  long lVar1;
  __int_type _Var2;
  holder<char> *phVar3;
  new_allocator<cs_impl::any::holder<char>_> *in_RSI;
  new_allocator<cs_impl::any::holder<char>_> *in_RDI;
  holder<char> *ptr;
  holder<char> *in_stack_ffffffffffffffd8;
  size_type __n;
  
  __n = 0;
  if (*(long *)(in_RDI + 0x208) != 0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base<unsigned_long> *)0x0);
    if (_Var2 == 0) {
      lVar1 = *(long *)(in_RDI + 0x208);
      *(long *)(in_RDI + 0x208) = lVar1 + -1;
      phVar3 = *(holder<char> **)(in_RDI + lVar1 * 8 + -8);
      goto LAB_0016bb32;
    }
  }
  phVar3 = __gnu_cxx::new_allocator<cs_impl::any::holder<char>_>::allocate(in_RSI,__n,in_RDI);
LAB_0016bb32:
  __gnu_cxx::new_allocator<cs_impl::any::holder<char>>::
  construct<cs_impl::any::holder<char>,char_const&>
            (in_RDI,in_stack_ffffffffffffffd8,(char *)0x16bb4d);
  return phVar3;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}